

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

bool __thiscall
Minisat::SimpSolver::merge
          (SimpSolver *this,Clause *_ps,Clause *_qs,Var v,vec<Minisat::Lit,_int> *out_clause)

{
  anon_struct_4_5_613047fb_for_header aVar1;
  anon_struct_4_5_613047fb_for_header aVar2;
  anon_struct_4_5_613047fb_for_header aVar3;
  anon_struct_4_5_613047fb_for_header *paVar4;
  undefined8 in_RAX;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  undefined8 local_38;
  
  this->merges = this->merges + 1;
  if (out_clause->data != (Lit *)0x0) {
    out_clause->sz = 0;
  }
  aVar1 = _ps->header;
  aVar2 = _qs->header;
  bVar8 = (uint)aVar1 >> 5 < (uint)aVar2 >> 5;
  aVar3 = aVar2;
  paVar4 = &_ps->header;
  if (bVar8) {
    aVar3 = aVar1;
    aVar1 = aVar2;
    paVar4 = &_qs->header;
  }
  uVar5 = (ulong)(uint)aVar3;
  if (bVar8) {
    _qs = _ps;
  }
  local_38 = in_RAX;
  if (0x1f < (uint)aVar3) {
    uVar7 = 0;
    do {
      aVar2 = (&_qs->header)[uVar7 + 1];
      if ((int)aVar2 >> 1 != v) {
        if (0x1f < (uint)*paVar4) {
          uVar6 = 0;
          do {
            if ((int)paVar4[uVar6 + 1] >> 1 == (int)aVar2 >> 1) {
              if (((uint)paVar4[uVar6 + 1] ^ (uint)aVar2) == 1) {
                return false;
              }
              goto LAB_00111076;
            }
            uVar6 = uVar6 + 1;
          } while ((uint)*paVar4 >> 5 != uVar6);
        }
        local_38 = CONCAT44(aVar2,local_38._0_4_);
        vec<Minisat::Lit,_int>::push(out_clause,(Lit *)((long)&local_38 + 4));
        uVar5 = (ulong)(uint)_qs->header;
      }
LAB_00111076:
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar5 >> 5);
    aVar1 = *paVar4;
  }
  uVar5 = (ulong)(uint)aVar1;
  if (0x1f < (uint)aVar1) {
    uVar7 = 0;
    do {
      if ((int)paVar4[uVar7 + 1] >> 1 != v) {
        local_38 = CONCAT44(local_38._4_4_,paVar4[uVar7 + 1]);
        vec<Minisat::Lit,_int>::push(out_clause,(Lit *)&local_38);
        uVar5 = (ulong)(uint)*paVar4;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar5 >> 5);
  }
  return true;
}

Assistant:

bool SimpSolver::merge(const Clause& _ps, const Clause& _qs, Var v, vec<Lit>& out_clause)
{
    merges++;
    out_clause.clear();

    bool  ps_smallest = _ps.size() < _qs.size();
    const Clause& ps  =  ps_smallest ? _qs : _ps;
    const Clause& qs  =  ps_smallest ? _ps : _qs;

    for (int i = 0; i < qs.size(); i++){
        if (var(qs[i]) != v){
            for (int j = 0; j < ps.size(); j++)
                if (var(ps[j]) == var(qs[i])){
                    if (ps[j] == ~qs[i])
                        return false;
                    else
                        goto next;
                }
            out_clause.push(qs[i]);
        }
        next:;
    }

    for (int i = 0; i < ps.size(); i++)
        if (var(ps[i]) != v)
            out_clause.push(ps[i]);

    return true;
}